

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O0

int xmlLoadCatalog(char *filename)

{
  xmlCatalogPtr pxVar1;
  xmlCatalogPtr catal;
  int ret;
  char *filename_local;
  
  xmlInitParser();
  xmlRMutexLock(&xmlCatalogMutex);
  if (xmlDefaultCatalog == (xmlCatalogPtr)0x0) {
    pxVar1 = xmlLoadACatalog(filename);
    if (pxVar1 == (xmlCatalogPtr)0x0) {
      xmlRMutexUnlock(&xmlCatalogMutex);
      filename_local._4_4_ = -1;
    }
    else {
      xmlDefaultCatalog = pxVar1;
      xmlRMutexUnlock(&xmlCatalogMutex);
      xmlCatalogInitialized = 1;
      filename_local._4_4_ = 0;
    }
  }
  else {
    filename_local._4_4_ = xmlExpandCatalog(xmlDefaultCatalog,filename);
    xmlRMutexUnlock(&xmlCatalogMutex);
  }
  return filename_local._4_4_;
}

Assistant:

int
xmlLoadCatalog(const char *filename)
{
    int ret;
    xmlCatalogPtr catal;

    xmlInitParser();

    xmlRMutexLock(&xmlCatalogMutex);

    if (xmlDefaultCatalog == NULL) {
	catal = xmlLoadACatalog(filename);
	if (catal == NULL) {
	    xmlRMutexUnlock(&xmlCatalogMutex);
	    return(-1);
	}

	xmlDefaultCatalog = catal;
	xmlRMutexUnlock(&xmlCatalogMutex);
        xmlCatalogInitialized = 1;
	return(0);
    }

    ret = xmlExpandCatalog(xmlDefaultCatalog, filename);
    xmlRMutexUnlock(&xmlCatalogMutex);
    return(ret);
}